

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O3

ShaderType deqp::gles31::Functional::getProgramTransformFeedbackStage(Program *program)

{
  bool bVar1;
  ShaderType SVar2;
  
  SVar2 = SHADERTYPE_GEOMETRY;
  bVar1 = ProgramInterfaceDefinition::Program::hasStage(program,SHADERTYPE_GEOMETRY);
  if (!bVar1) {
    SVar2 = SHADERTYPE_TESSELLATION_EVALUATION;
    bVar1 = ProgramInterfaceDefinition::Program::hasStage
                      (program,SHADERTYPE_TESSELLATION_EVALUATION);
    if (!bVar1) {
      bVar1 = ProgramInterfaceDefinition::Program::hasStage(program,SHADERTYPE_VERTEX);
      SVar2 = SHADERTYPE_LAST;
      if (bVar1) {
        SVar2 = SHADERTYPE_VERTEX;
      }
    }
  }
  return SVar2;
}

Assistant:

glu::ShaderType getProgramTransformFeedbackStage (const ProgramInterfaceDefinition::Program* program)
{
	if (program->hasStage(glu::SHADERTYPE_GEOMETRY))
		return glu::SHADERTYPE_GEOMETRY;

	if (program->hasStage(glu::SHADERTYPE_TESSELLATION_EVALUATION))
		return glu::SHADERTYPE_TESSELLATION_EVALUATION;

	if (program->hasStage(glu::SHADERTYPE_VERTEX))
		return glu::SHADERTYPE_VERTEX;

	DE_ASSERT(false);
	return glu::SHADERTYPE_LAST;
}